

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_log_formatter.hpp
# Opt level: O3

void __thiscall boost::unit_test::log_entry_data::log_entry_data(log_entry_data *this)

{
  (this->m_file_name)._M_dataplus._M_p = (pointer)&(this->m_file_name).field_2;
  (this->m_file_name)._M_string_length = 0;
  (this->m_file_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)this);
  return;
}

Assistant:

struct BOOST_TEST_DECL log_entry_data {
    log_entry_data()
    {
        m_file_name.reserve( 200 );
    }

    std::string     m_file_name; ///< log entry file name
    std::size_t     m_line_num;  ///< log entry line number
    log_level       m_level;     ///< log entry level

    void clear()
    {
        m_file_name.erase();
        m_line_num      = 0;
        m_level     = log_nothing;
    }
}